

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSortersTestCase.cpp
# Opt level: O2

void __thiscall FIX::TestheaderOrder::~TestheaderOrder(TestheaderOrder *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(headerOrder)
{
  CHECK( !header_order::compare(FIELD::BeginString, FIELD::BeginString) );
  CHECK( header_order::compare(FIELD::BeginString, FIELD::BodyLength) );
  CHECK( header_order::compare(FIELD::BeginString, FIELD::MsgType) );
  CHECK( header_order::compare(FIELD::BeginString, 1) );
  CHECK( header_order::compare(FIELD::BeginString, 100) );
  CHECK( header_order::compare(FIELD::BeginString, 0) );

  CHECK( !header_order::compare(FIELD::BodyLength, FIELD::BeginString) );
  CHECK( !header_order::compare(FIELD::BodyLength, FIELD::BodyLength) );
  CHECK( header_order::compare(FIELD::BodyLength, FIELD::MsgType) );
  CHECK( header_order::compare(FIELD::BodyLength, 1) );
  CHECK( header_order::compare(FIELD::BeginString, 100) );
  CHECK( header_order::compare(FIELD::BodyLength, 0) );

  CHECK( !header_order::compare(FIELD::MsgType, FIELD::BeginString) );
  CHECK( !header_order::compare(FIELD::MsgType, FIELD::BodyLength) );
  CHECK( !header_order::compare(FIELD::MsgType, FIELD::MsgType) );
  CHECK( header_order::compare(FIELD::MsgType, 1) );
  CHECK( header_order::compare(FIELD::BeginString, 100) );
  CHECK( header_order::compare(FIELD::MsgType, 0) );

  CHECK( !header_order::compare(1, FIELD::BeginString) );
  CHECK( !header_order::compare(1, FIELD::BodyLength) );
  CHECK( !header_order::compare(1, FIELD::MsgType) );
  CHECK( !header_order::compare(1, 1) );
  CHECK( header_order::compare(1, 100) );
  CHECK( !header_order::compare(1, 0) );

  CHECK( !header_order::compare(100, FIELD::BeginString) );
  CHECK( !header_order::compare(100, FIELD::BodyLength) );
  CHECK( !header_order::compare(100, FIELD::MsgType) );
  CHECK( !header_order::compare(100, 1) );
  CHECK( !header_order::compare(100, 100) );
  CHECK( !header_order::compare(100, 0) );

  CHECK( !header_order::compare(0, FIELD::BeginString) );
  CHECK( !header_order::compare(0, FIELD::BodyLength) );
  CHECK( !header_order::compare(0, FIELD::MsgType) );
  CHECK( header_order::compare(0, 1) );
  CHECK( header_order::compare(0, 100) );
  CHECK( !header_order::compare(0, 0) );
}